

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_permute(ggml_context *ctx,ggml_tensor *a,int axis0,int axis1,int axis2,int axis3)

{
  int in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int32_t params [4];
  int nb [4];
  int ne [4];
  ggml_tensor *result;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38 [4];
  ggml_tensor *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ggml_tensor *local_10;
  
  if ((in_EDX < 0) || (3 < in_EDX)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xcb6
               ,"GGML_ASSERT(%s) failed","axis0 >= 0 && axis0 < GGML_MAX_DIMS");
  }
  if ((in_ECX < 0) || (3 < in_ECX)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xcb7
               ,"GGML_ASSERT(%s) failed","axis1 >= 0 && axis1 < GGML_MAX_DIMS");
  }
  if ((in_R8D < 0) || (3 < in_R8D)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xcb8
               ,"GGML_ASSERT(%s) failed","axis2 >= 0 && axis2 < GGML_MAX_DIMS");
  }
  if ((-1 < in_R9D) && (in_R9D < 4)) {
    if (in_EDX == in_ECX) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcbb,"GGML_ASSERT(%s) failed","axis0 != axis1");
    }
    if (in_EDX == in_R8D) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcbc,"GGML_ASSERT(%s) failed","axis0 != axis2");
    }
    if (in_EDX == in_R9D) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcbd,"GGML_ASSERT(%s) failed","axis0 != axis3");
    }
    if (in_ECX == in_R8D) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcbe,"GGML_ASSERT(%s) failed","axis1 != axis2");
    }
    if (in_ECX == in_R9D) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcbf,"GGML_ASSERT(%s) failed","axis1 != axis3");
    }
    if (in_R8D == in_R9D) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xcc0,"GGML_ASSERT(%s) failed","axis2 != axis3");
    }
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_28 = ggml_view_tensor((ggml_context *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (ggml_tensor *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    ggml_format_name(local_28,"%s (permuted)",local_10->name);
    local_38[local_14] = (int)local_10->ne[0];
    local_38[local_18] = (int)local_10->ne[1];
    local_38[local_1c] = (int)local_10->ne[2];
    local_38[local_20] = (int)local_10->ne[3];
    *(int *)(&stack0xffffffffffffffb8 + (long)local_14 * 4) = (int)local_10->nb[0];
    *(int *)(&stack0xffffffffffffffb8 + (long)local_18 * 4) = (int)local_10->nb[1];
    *(int *)(&stack0xffffffffffffffb8 + (long)local_1c * 4) = (int)local_10->nb[2];
    *(int *)(&stack0xffffffffffffffb8 + (long)local_20 * 4) = (int)local_10->nb[3];
    local_28->ne[0] = (long)local_38[0];
    local_28->ne[1] = (long)local_38[1];
    local_28->ne[2] = (long)local_38[2];
    local_28->ne[3] = (long)local_38[3];
    local_28->nb[0] = (long)in_stack_ffffffffffffffb8;
    local_28->nb[1] = (long)in_stack_ffffffffffffffbc;
    local_28->nb[2] = (long)in_stack_ffffffffffffffc0;
    local_28->nb[3] = (long)in_stack_ffffffffffffffc4;
    local_28->op = GGML_OP_PERMUTE;
    local_28->src[0] = local_10;
    ggml_set_op_params((ggml_tensor *)CONCAT44(local_20,local_1c),
                       (void *)CONCAT44(local_18,local_14),0x14e71f);
    return local_28;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xcb9,
             "GGML_ASSERT(%s) failed","axis3 >= 0 && axis3 < GGML_MAX_DIMS");
}

Assistant:

struct ggml_tensor * ggml_permute(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   axis0,
        int                   axis1,
        int                   axis2,
        int                   axis3) {
    GGML_ASSERT(axis0 >= 0 && axis0 < GGML_MAX_DIMS);
    GGML_ASSERT(axis1 >= 0 && axis1 < GGML_MAX_DIMS);
    GGML_ASSERT(axis2 >= 0 && axis2 < GGML_MAX_DIMS);
    GGML_ASSERT(axis3 >= 0 && axis3 < GGML_MAX_DIMS);

    GGML_ASSERT(axis0 != axis1);
    GGML_ASSERT(axis0 != axis2);
    GGML_ASSERT(axis0 != axis3);
    GGML_ASSERT(axis1 != axis2);
    GGML_ASSERT(axis1 != axis3);
    GGML_ASSERT(axis2 != axis3);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);
    ggml_format_name(result, "%s (permuted)", a->name);

    int ne[GGML_MAX_DIMS];
    int nb[GGML_MAX_DIMS];

    ne[axis0] = a->ne[0];
    ne[axis1] = a->ne[1];
    ne[axis2] = a->ne[2];
    ne[axis3] = a->ne[3];

    nb[axis0] = a->nb[0];
    nb[axis1] = a->nb[1];
    nb[axis2] = a->nb[2];
    nb[axis3] = a->nb[3];

    result->ne[0] = ne[0];
    result->ne[1] = ne[1];
    result->ne[2] = ne[2];
    result->ne[3] = ne[3];

    result->nb[0] = nb[0];
    result->nb[1] = nb[1];
    result->nb[2] = nb[2];
    result->nb[3] = nb[3];

    result->op     = GGML_OP_PERMUTE;
    result->src[0] = a;

    int32_t params[] = { axis0, axis1, axis2, axis3 };
    ggml_set_op_params(result, params, sizeof(params));

    return result;
}